

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O3

bool __thiscall
optimization::livevar_analyse::Livevar_Analyse::bfs_build(Livevar_Analyse *this,BasicBlk *start)

{
  _Rb_tree_color _Var1;
  BasicBlk *pBVar2;
  undefined8 *******pppppppuVar3;
  undefined8 *******pppppppuVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  _List_node_base *p_Var7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  bool bVar13;
  value_type id;
  list<int,_std::allocator<int>_> queue;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  int local_7c;
  undefined8 *******local_78;
  undefined8 *******local_70;
  long local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_68 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = &local_78;
  local_70 = &local_78;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  *(LabelId *)&p_Var7[1]._M_next = start->id;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  local_68 = local_68 + 1;
  bVar13 = false;
  if ((undefined8 ********)local_78 != &local_78) {
    do {
      local_7c = *(int *)(local_78 + 2);
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001213ef:
        pmVar8 = std::
                 map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                 ::at(&this->livevars,&local_7c);
        bVar6 = Block_Live_Var::build
                          ((pmVar8->
                           super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,&local_7c);
        pmVar8 = std::
                 map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                 ::at(&this->livevars,&local_7c);
        bVar13 = (bool)(bVar13 | bVar6);
        pBVar2 = ((pmVar8->
                  super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->block;
        for (p_Var9 = *(_Base_ptr *)
                       ((long)&(pBVar2->preceding)._M_t._M_impl.super__Rb_tree_header._M_header +
                       0x10);
            (_Rb_tree_header *)p_Var9 != &(pBVar2->preceding)._M_t._M_impl.super__Rb_tree_header;
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
          _Var1 = p_Var9[1]._M_color;
          p_Var7 = (_List_node_base *)operator_new(0x18);
          *(_Rb_tree_color *)&p_Var7[1]._M_next = _Var1;
          std::__detail::_List_node_base::_M_hook(p_Var7);
          local_68 = local_68 + 1;
        }
      }
      else {
        p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var12 = &local_60._M_impl.super__Rb_tree_header._M_header;
        do {
          p_Var11 = p_Var12;
          p_Var10 = p_Var5;
          _Var1 = p_Var10[1]._M_color;
          p_Var12 = p_Var10;
          if ((int)_Var1 < local_7c) {
            p_Var12 = p_Var11;
          }
          p_Var5 = (&p_Var10->_M_left)[(int)_Var1 < local_7c];
        } while ((&p_Var10->_M_left)[(int)_Var1 < local_7c] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var12 == &local_60._M_impl.super__Rb_tree_header)
        goto LAB_001213ef;
        if ((int)_Var1 < local_7c) {
          p_Var10 = p_Var11;
        }
        if (local_7c < (int)p_Var10[1]._M_color) goto LAB_001213ef;
      }
      pppppppuVar4 = local_78;
      local_68 = local_68 + -1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(pppppppuVar4,0x18);
    } while ((undefined8 ********)local_78 != &local_78);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  pppppppuVar4 = local_78;
  while ((undefined8 ********)pppppppuVar4 != &local_78) {
    pppppppuVar3 = (undefined8 *******)*pppppppuVar4;
    operator_delete(pppppppuVar4,0x18);
    pppppppuVar4 = pppppppuVar3;
  }
  return bVar13;
}

Assistant:

bool bfs_build(mir::inst::BasicBlk& start) {
    std::list<mir::types::LabelId> queue;
    std::set<mir::types::LabelId> visited;
    queue.push_back(start.id);
    bool modify = false;
    while (!queue.empty()) {
      auto id = queue.front();
      if (!visited.count(id)) {
        modify |= livevars.at(id)->build();
        visited.insert(id);
        for (auto pre : livevars.at(id)->block.preceding) {
          queue.push_back(pre);
        }
      }
      queue.pop_front();
    }

    return modify;
  }